

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void slang::uintToStrImpl<unsigned_long>
               (SmallVectorBase<char> *buffer,char *format,unsigned_long value)

{
  int iVar1;
  size_type index;
  size_type sVar2;
  reference __s;
  size_t offset;
  size_t sz;
  unsigned_long value_local;
  char *format_local;
  SmallVectorBase<char> *buffer_local;
  
  iVar1 = snprintf((char *)0x0,0,format,value);
  index = SmallVectorBase<char>::size(buffer);
  sVar2 = SmallVectorBase<char>::size(buffer);
  SmallVectorBase<char>::resize(buffer,sVar2 + (long)iVar1 + 1);
  __s = SmallVectorBase<char>::operator[](buffer,index);
  snprintf(__s,(long)iVar1 + 1,format,value);
  SmallVectorBase<char>::pop_back(buffer);
  return;
}

Assistant:

void uintToStrImpl(SmallVectorBase<char>& buffer, const char* format, T value) {
    size_t sz = (size_t)snprintf(nullptr, 0, format, value);
    size_t offset = buffer.size();
    buffer.resize(buffer.size() + sz + 1);

    snprintf(&buffer[offset], sz + 1, format, value);
    buffer.pop_back();
}